

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random_streams.cpp
# Opt level: O2

ostream * despot::operator<<(ostream *os,RandomStreams *stream)

{
  int iVar1;
  ostream *poVar2;
  int j;
  long lVar3;
  int i;
  long lVar4;
  
  for (lVar4 = 0;
      lVar4 < (int)(((long)(stream->streams_).
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(stream->streams_).
                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x18); lVar4 = lVar4 + 1) {
    poVar2 = std::operator<<(os,"Stream ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)lVar4);
    std::operator<<(poVar2,":");
    lVar3 = 0;
    while( true ) {
      iVar1 = RandomStreams::Length(stream);
      if (iVar1 <= lVar3) break;
      std::operator<<(os," ");
      std::ostream::_M_insert<double>
                (*(double *)
                  (*(long *)&(stream->streams_).
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[lVar4].
                             super__Vector_base<double,_std::allocator<double>_>._M_impl + lVar3 * 8
                  ));
      lVar3 = lVar3 + 1;
    }
    std::endl<char,std::char_traits<char>>(os);
  }
  return os;
}

Assistant:

ostream& operator<<(ostream& os, const RandomStreams& stream) {
	for (int i = 0; i < stream.NumStreams(); i++) {
		os << "Stream " << i << ":";
		for (int j = 0; j < stream.Length(); j++) {
			os << " " << stream.Entry(i, j);
		}
		os << endl;
	}
	return os;
}